

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bidi_test.c
# Opt level: O3

int main(int argc,char **argv)

{
  char *__s1;
  bool bVar1;
  int iVar2;
  FILE *__stream;
  char *__format;
  code *pcVar3;
  bool bVar4;
  bool bVar5;
  
  ctx = bidi_new_context();
  if (1 < argc) {
    bVar4 = true;
    bVar5 = false;
    pcVar3 = (code *)0x0;
    do {
      while( true ) {
        argv = argv + 1;
        __s1 = *argv;
        if (((bVar4) && (*__s1 == '-')) && (__s1[1] != '\0')) break;
        if (pcVar3 == (code *)0x0) {
          __format = "no mode argument provided before filename \'%s\'\n";
LAB_00101460:
          fprintf(_stderr,__format,__s1);
          return 1;
        }
        if ((*__s1 == '-') && (__s1[1] == '\0')) {
          (*pcVar3)("<standard input>",_stdin);
        }
        else {
          __stream = fopen(__s1,"r");
          if (__stream == (FILE *)0x0) {
            __format = "unable to open \'%s\'\n";
            goto LAB_00101460;
          }
          (*pcVar3)(__s1,__stream);
          fclose(__stream);
        }
        bVar5 = true;
        bVar1 = (uint)argc < 3;
        argc = argc - 1;
        if (bVar1) goto LAB_001013f1;
      }
      if ((__s1[1] == '-') && (__s1[2] == '\0')) {
        bVar4 = false;
      }
      else {
        iVar2 = strcmp(__s1,"--class");
        bVar4 = true;
        if (iVar2 == 0) {
          pcVar3 = class_test;
        }
        else {
          iVar2 = strcmp(__s1,"--char");
          pcVar3 = char_test;
          if (iVar2 != 0) {
            iVar2 = strcmp(__s1,"--help");
            if (iVar2 == 0) {
              fwrite("usage:   bidi_test ( ( --class | --char ) infile... )...\ne.g.:    bidi_test --class BidiTest.txt --char BidiCharacterTest.txt\nalso:    --help              display this text\n"
                     ,0xad,1,_stdout);
              return 0;
            }
            __format = "unrecognised option \'%s\'\n";
            goto LAB_00101460;
          }
        }
      }
      bVar1 = 2 < (uint)argc;
      argc = argc - 1;
    } while (bVar1);
    if (bVar5) {
LAB_001013f1:
      printf("pass %d fail %d total %d\n",(ulong)(uint)pass,(ulong)(uint)fail,
             (ulong)(uint)(fail + pass));
      bidi_free_context(ctx);
      return (uint)(fail != 0);
    }
  }
  main_cold_1();
  return 1;
}

Assistant:

int main(int argc, char **argv)
{
    void (*testfn)(const char *, FILE *) = NULL;
    bool doing_opts = true;
    const char *filename = NULL;
    bool done_something = false;

    ctx = bidi_new_context();

    while (--argc > 0) {
        const char *arg = *++argv;
        if (doing_opts && arg[0] == '-' && arg[1]) {
            if (!strcmp(arg, "--")) {
                doing_opts = false;
            } else if (!strcmp(arg, "--class")) {
                testfn = class_test;
            } else if (!strcmp(arg, "--char")) {
                testfn = char_test;
            } else if (!strcmp(arg, "--help")) {
                usage(stdout);
                return 0;
            } else {
                fprintf(stderr, "unrecognised option '%s'\n", arg);
                return 1;
            }
        } else {
            const char *filename = arg;

            if (!testfn) {
                fprintf(stderr, "no mode argument provided before filename "
                        "'%s'\n", filename);
                return 1;
            }

            if (!strcmp(filename, "-")) {
                testfn("<standard input>", stdin);
            } else {
                FILE *fp = fopen(filename, "r");
                if (!fp) {
                    fprintf(stderr, "unable to open '%s'\n", filename);
                    return 1;
                }
                testfn(filename, fp);
                fclose(fp);
            }
            done_something = true;
        }
    }

    if (!done_something) {
        usage(stderr);
        return 1;
    }

    if (!filename)
        filename = "-";

    printf("pass %d fail %d total %d\n", pass, fail, pass + fail);

    bidi_free_context(ctx);
    return fail != 0;
}